

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlReadDoc(xmlChar *str,char *url,char *encoding,int options)

{
  htmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input_00;
  undefined8 local_48;
  htmlDocPtr doc;
  xmlParserInputPtr input;
  htmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *url_local;
  xmlChar *str_local;
  
  local_48 = (htmlDocPtr)0x0;
  ctxt_00 = htmlNewParserCtxt();
  if (ctxt_00 == (htmlParserCtxtPtr)0x0) {
    str_local = (xmlChar *)0x0;
  }
  else {
    htmlCtxtUseOptions(ctxt_00,options);
    input_00 = xmlCtxtNewInputFromString(ctxt_00,url,(char *)str,encoding,XML_INPUT_BUF_STATIC);
    if (input_00 != (xmlParserInputPtr)0x0) {
      local_48 = htmlCtxtParseDocument(ctxt_00,input_00);
    }
    htmlFreeParserCtxt(ctxt_00);
    str_local = (xmlChar *)local_48;
  }
  return (htmlDocPtr)str_local;
}

Assistant:

htmlDocPtr
htmlReadDoc(const xmlChar *str, const char *url, const char *encoding,
            int options)
{
    htmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    htmlDocPtr doc = NULL;

    ctxt = htmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    htmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromString(ctxt, url, (const char *) str, encoding,
                                      XML_INPUT_BUF_STATIC);

    if (input != NULL)
        doc = htmlCtxtParseDocument(ctxt, input);

    htmlFreeParserCtxt(ctxt);
    return(doc);
}